

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rapidxml.hpp
# Opt level: O0

xml_node<char> * __thiscall
rapidxml::xml_document<char>::parse_pi<0>(xml_document<char> *this,char **text)

{
  parse_error *this_00;
  bool bVar1;
  char **text_local;
  xml_document<char> *this_local;
  
  while( true ) {
    bVar1 = true;
    if (**text == '?') {
      bVar1 = (*text)[1] != '>';
    }
    if (!bVar1) break;
    if (**text == '\0') {
      this_00 = (parse_error *)__cxa_allocate_exception(0x18);
      parse_error::parse_error(this_00,"unexpected end of data",*text);
      __cxa_throw(this_00,&parse_error::typeinfo,parse_error::~parse_error);
    }
    *text = *text + 1;
  }
  *text = *text + 2;
  return (xml_node<char> *)0x0;
}

Assistant:

xml_node<Ch> *parse_pi(Ch *&text)
        {
            // If creation of PI nodes is enabled
            if (Flags & parse_pi_nodes)
            {
                // Create pi node
                xml_node<Ch> *pi = this->allocate_node(node_pi);

                // Extract PI target name
                Ch *name = text;
                skip<node_name_pred, Flags>(text);
                if (text == name)
                    RAPIDXML_PARSE_ERROR("expected PI target", text);
                pi->name(name, text - name);

                // Skip whitespace between pi target and pi
                skip<whitespace_pred, Flags>(text);

                // Remember start of pi
                Ch *value = text;

                // Skip to '?>'
                while (text[0] != Ch('?') || text[1] != Ch('>'))
                {
                    if (*text == Ch('\0'))
                        RAPIDXML_PARSE_ERROR("unexpected end of data", text);
                    ++text;
                }

                // Set pi value (verbatim, no entity expansion or whitespace normalization)
                pi->value(value, text - value);

                // Place zero terminator after name and value
                if (!(Flags & parse_no_string_terminators))
                {
                    pi->name()[pi->name_size()] = Ch('\0');
                    pi->value()[pi->value_size()] = Ch('\0');
                }

                text += 2;                          // Skip '?>'
                return pi;
            }
            else
            {
                // Skip to '?>'
                while (text[0] != Ch('?') || text[1] != Ch('>'))
                {
                    if (*text == Ch('\0'))
                        RAPIDXML_PARSE_ERROR("unexpected end of data", text);
                    ++text;
                }
                text += 2;    // Skip '?>'
                return 0;
            }
        }